

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O3

UChar32 __thiscall
icu_63::number::impl::NumberStringBuilder::getLastCodePoint(NumberStringBuilder *this)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  ValueOrHeapArray<char16_t> *pVVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  
  iVar2 = this->fLength;
  lVar9 = (long)iVar2;
  if (lVar9 == 0) {
    uVar5 = 0xffffffff;
  }
  else {
    if (this->fUsingHeap == false) {
      pVVar7 = &this->fChars;
    }
    else {
      pVVar7 = (ValueOrHeapArray<char16_t> *)(this->fChars).heap.ptr;
    }
    iVar3 = this->fZero;
    uVar11 = lVar9 - 1;
    uVar4 = *(ushort *)((long)pVVar7 + lVar9 * 2 + (long)iVar3 * 2 + -2);
    if ((1 < iVar2) && ((uVar4 & 0xfc00) == 0xdc00)) {
      uVar11 = uVar11 & 0xffffffff;
      if ((*(ushort *)((long)pVVar7 + lVar9 * 2 + (long)iVar3 * 2 + -4) & 0xfc00) == 0xd800) {
        uVar11 = (ulong)(iVar2 - 2);
      }
      uVar4 = *(ushort *)((long)pVVar7 + uVar11 * 2 + (long)iVar3 * 2);
    }
    uVar6 = (uint)uVar4;
    uVar5 = (uint)uVar4;
    if ((uVar5 & 0xf800) == 0xd800) {
      if ((uVar4 >> 10 & 1) == 0) {
        iVar10 = (int)uVar11 + 1;
        if (iVar10 == iVar2) {
          return uVar5;
        }
        uVar1 = *(ushort *)((long)pVVar7 + (long)iVar10 * 2 + (long)iVar3 * 2);
        uVar8 = (uint)uVar1;
        if ((uVar1 & 0xfc00) != 0xdc00) {
          return uVar5;
        }
        uVar6 = (uint)uVar4 << 10;
      }
      else {
        if ((int)uVar11 < 1) {
          return uVar5;
        }
        uVar4 = *(ushort *)((long)pVVar7 + (uVar11 & 0xffffffff) * 2 + (long)iVar3 * 2 + -2);
        if ((uVar4 & 0xfc00) != 0xd800) {
          return uVar5;
        }
        uVar8 = (uint)uVar4 << 10;
      }
      return uVar6 + uVar8 + -0x35fdc00;
    }
  }
  return uVar5;
}

Assistant:

UChar32 NumberStringBuilder::getLastCodePoint() const {
    if (fLength == 0) {
        return -1;
    }
    int32_t offset = fLength;
    U16_BACK_1(getCharPtr() + fZero, 0, offset);
    UChar32 cp;
    U16_GET(getCharPtr() + fZero, 0, offset, fLength, cp);
    return cp;
}